

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

int nghttp2_http_on_header
              (nghttp2_session *session,nghttp2_stream *stream,nghttp2_frame *frame,
              nghttp2_hd_nv *nv,int trailer)

{
  byte *pbVar1;
  short sVar2;
  nghttp2_rcbuf *pnVar3;
  byte bVar4;
  uint8_t uVar5;
  int iVar6;
  int64_t iVar7;
  uint32_t flag;
  size_t sVar8;
  int iVar9;
  size_t sVar10;
  uint8_t *puVar11;
  char *a;
  bool bVar12;
  size_t sStack_40;
  nghttp2_extpri nStack_38;
  
  iVar6 = nghttp2_check_header_name(nv->name->base,nv->name->len);
  if (iVar6 == 0) {
    pnVar3 = nv->name;
    if ((pnVar3->len != 0) && (*pnVar3->base == ':')) {
      return -0x213;
    }
    sVar10 = 0;
    while (pnVar3->len != sVar10) {
      puVar11 = pnVar3->base + sVar10;
      sVar10 = sVar10 + 1;
      if (0xe5 < (byte)(*puVar11 + 0xa5)) {
        return -0x213;
      }
    }
    goto LAB_00114f83;
  }
  iVar6 = nv->token;
  switch(iVar6) {
  case 0:
    goto switchD_00114da6_caseD_0;
  case 1:
    iVar6 = nghttp2_check_method(nv->value->base,nv->value->len);
    break;
  case 2:
  case 4:
switchD_00114da6_caseD_2:
    bVar4 = stream->flags;
LAB_00114e90:
    puVar11 = nv->value->base;
    sVar10 = nv->value->len;
    goto joined_r0x00114e9e;
  case 3:
    iVar6 = nghttp2_check_path(nv->value->base,nv->value->len);
    break;
  case 5:
    sVar10 = nv->value->len;
    if ((sVar10 != 0) && (pbVar1 = nv->value->base, (byte)((*pbVar1 & 0xdf) + 0xbf) < 0x1a)) {
      for (sVar8 = 1; sVar10 != sVar8; sVar8 = sVar8 + 1) {
        bVar4 = pbVar1[sVar8];
        if (((9 < (byte)(bVar4 - 0x30)) && (0x19 < (byte)((bVar4 & 0xdf) + 0xbf))) &&
           ((0x2e < bVar4 || ((0x680000000000U >> ((ulong)bVar4 & 0x3f) & 1) == 0))))
        goto LAB_00114f63;
      }
      goto LAB_00114f4c;
    }
    goto LAB_00114f63;
  default:
    if (iVar6 != 0x25) {
      if (iVar6 != 0x42) goto switchD_00114da6_caseD_2;
      bVar4 = stream->flags;
      if ((bVar4 & 0x40) != 0) {
        for (sVar10 = 0; nv->value->len != sVar10; sVar10 = sVar10 + 1) {
          uVar5 = nv->value->base[sVar10];
          if ((uVar5 != ' ') && (uVar5 != '\t')) goto LAB_00114e90;
        }
        goto LAB_00114f63;
      }
      goto LAB_00114e90;
    }
switchD_00114da6_caseD_0:
    if ((session->server == '\0') && ((frame->hd).type != '\x05')) {
      bVar4 = stream->flags;
      puVar11 = nv->value->base;
      sVar10 = nv->value->len;
joined_r0x00114e9e:
      if ((bVar4 & 0x40) == 0) {
        iVar6 = nghttp2_check_header_value_rfc9113(puVar11,sVar10);
      }
      else {
        iVar6 = nghttp2_check_header_value(puVar11,sVar10);
      }
      break;
    }
    sVar10 = 0;
    do {
      if (nv->value->len == sVar10) goto LAB_00114f4c;
      pbVar1 = nv->value->base + sVar10;
      sVar10 = sVar10 + 1;
    } while (""[*pbVar1] != '\0');
    goto LAB_00114f63;
  }
  if (iVar6 == 0) {
LAB_00114f63:
    if (nv->name->len == 0) {
      __assert_fail("nv->name->len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_http.c"
                    ,0x1f6,
                    "int nghttp2_http_on_header(nghttp2_session *, nghttp2_stream *, nghttp2_frame *, nghttp2_hd_nv *, int)"
                   );
    }
    if (*nv->name->base == ':') {
      return -0x213;
    }
LAB_00114f83:
    *(byte *)&stream->http_flags = (byte)stream->http_flags | 0x40;
    return -0x69;
  }
LAB_00114f4c:
  if (session->server == '\0') {
    bVar12 = true;
    if ((frame->hd).type == '\x05') goto LAB_00114fa0;
    puVar11 = nv->name->base;
    if (*puVar11 == ':') {
      if (trailer != 0) {
        return -0x213;
      }
      if ((stream->http_flags & 0x40) != 0) {
        return -0x213;
      }
    }
    iVar6 = nv->token;
    if (iVar6 - 0x3eU < 4) {
      return -0x213;
    }
    if (iVar6 == 0x3d) {
      if (nv->value->len != 8) {
        return -0x213;
      }
      iVar6 = memieq("trailers",nv->value->base,8);
      if (iVar6 == 0) {
        return -0x213;
      }
    }
    else if (iVar6 == 0x1b) {
      sVar2 = stream->status_code;
      if (sVar2 == 0xcc) {
        if (stream->content_length != -1) {
          return -0x213;
        }
        if (nv->value->len == 1) {
          iVar6 = memieq("0",nv->value->base,1);
          if (iVar6 != 0) {
            stream->content_length = 0;
            return -0x6a;
          }
          return -0x213;
        }
        return -0x213;
      }
      if ((ushort)(sVar2 - 100U) < 100) {
        return -0x213;
      }
      if (((ushort)(sVar2 - 200U) < 100) && ((stream->http_flags & 0x80) != 0)) {
        return -0x6a;
      }
      if (stream->content_length != -1) {
        return -0x213;
      }
      iVar7 = parse_uint(nv->value->base,nv->value->len);
      stream->content_length = iVar7;
      if (iVar7 == -1) {
        return -0x213;
      }
    }
    else {
      if (iVar6 == 0x38) {
        return -0x213;
      }
      if (iVar6 == 7) {
        iVar6 = check_pseudo_header(stream,nv,0x20);
        if (iVar6 == 0) {
          return -0x213;
        }
        if (nv->value->len != 3) {
          return -0x213;
        }
        iVar7 = parse_uint(nv->value->base,3);
        stream->status_code = (short)iVar7;
        if ((short)iVar7 == 0x65) {
          return -0x213;
        }
        if (((uint)iVar7 & 0xffff) == 0xffff) {
          return -0x213;
        }
        puVar11 = nv->name->base;
      }
      else if (*puVar11 == ':') {
        return -0x213;
      }
    }
    if (*puVar11 == ':') {
      return 0;
    }
    goto LAB_001151a6;
  }
  bVar12 = session->pending_enable_connect_protocol == '\0';
LAB_00114fa0:
  uVar5 = *nv->name->base;
  if (uVar5 == ':') {
    if (trailer != 0) {
      return -0x213;
    }
    if ((stream->http_flags & 0x40) != 0) {
      return -0x213;
    }
  }
  iVar6 = nv->token;
  iVar9 = -0x213;
  switch(iVar6) {
  case 0x38:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
    goto switchD_00114fe7_caseD_38;
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
switchD_00114fe7_caseD_39:
    if (uVar5 == ':') {
      return -0x213;
    }
    break;
  case 0x3d:
    if (nv->value->len != 8) {
      return -0x213;
    }
    iVar6 = memieq("trailers",nv->value->base,8);
    goto LAB_00115194;
  case 0x42:
    if (bVar12) {
      return -0x213;
    }
    flag = 0x8000;
LAB_0011518f:
    iVar6 = check_pseudo_header(stream,nv,flag);
LAB_00115194:
    if (iVar6 == 0) {
      return -0x213;
    }
    break;
  case 0x43:
    if ((((trailer == 0) && ((stream->stream_id & 1) != 0)) && ((stream->flags & 0x10) != 0)) &&
       ((stream->http_flags & 0x20000) == 0)) {
      nghttp2_extpri_from_uint8(&nStack_38,stream->http_extpri);
      iVar6 = nghttp2_http_parse_priority(&nStack_38,nv->value->base,nv->value->len);
      if (iVar6 == 0) {
        uVar5 = nghttp2_extpri_to_uint8(&nStack_38);
        stream->http_extpri = uVar5;
        pbVar1 = (byte *)((long)&stream->http_flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      else {
        stream->http_flags = stream->http_flags & 0xfffcffff | 0x20000;
      }
    }
    break;
  default:
    switch(iVar6) {
    case 0:
      flag = 1;
      goto LAB_0011518f;
    case 1:
      iVar6 = check_pseudo_header(stream,nv,4);
      if (iVar6 == 0) {
        return -0x213;
      }
      pnVar3 = nv->value;
      if (pnVar3->len == 7) {
        puVar11 = pnVar3->base;
        if (puVar11[6] == 'S') {
          iVar6 = bcmp("OPTIONS",puVar11,7);
          if (iVar6 == 0) {
            pbVar1 = (byte *)((long)&stream->http_flags + 1);
            *pbVar1 = *pbVar1 | 2;
          }
        }
        else if ((puVar11[6] == 'T') && (iVar6 = bcmp("CONNECT",puVar11,7), iVar6 == 0)) {
          if ((stream->stream_id & 1) == 0) {
            return -0x213;
          }
          *(byte *)&stream->http_flags = (byte)stream->http_flags | 0x80;
        }
      }
      else if ((pnVar3->len == 4) && (*(int *)pnVar3->base == 0x44414548)) {
        pbVar1 = (byte *)((long)&stream->http_flags + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      break;
    case 2:
    case 4:
      goto switchD_00114fe7_caseD_39;
    case 3:
      iVar6 = check_pseudo_header(stream,nv,2);
      if (iVar6 == 0) {
        return -0x213;
      }
      uVar5 = *nv->value->base;
      if (uVar5 == '/') {
        pbVar1 = (byte *)((long)&stream->http_flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      else if ((uVar5 == '*') && (nv->value->len == 1)) {
        pbVar1 = (byte *)((long)&stream->http_flags + 1);
        *pbVar1 = *pbVar1 | 0x10;
      }
      break;
    case 5:
      iVar6 = check_pseudo_header(stream,nv,8);
      if (iVar6 == 0) {
        return -0x213;
      }
      pnVar3 = nv->value;
      if (pnVar3->len == 5) {
        puVar11 = pnVar3->base;
        a = "https";
        sStack_40 = 5;
      }
      else {
        if (pnVar3->len != 4) break;
        puVar11 = pnVar3->base;
        a = "http";
        sStack_40 = 4;
      }
      iVar6 = memieq(a,puVar11,sStack_40);
      if (iVar6 != 0) {
        pbVar1 = (byte *)((long)&stream->http_flags + 1);
        *pbVar1 = *pbVar1 | 0x20;
      }
      break;
    default:
      if (iVar6 != 0x1b) {
        if (iVar6 == 0x25) {
          flag = 0x10;
          goto LAB_0011518f;
        }
        goto switchD_00114fe7_caseD_39;
      }
      if (stream->content_length != -1) {
        return -0x213;
      }
      iVar7 = parse_uint(nv->value->base,nv->value->len);
      stream->content_length = iVar7;
      if (iVar7 == -1) {
        return -0x213;
      }
    }
  }
  iVar9 = 0;
  if (*nv->name->base != ':') {
LAB_001151a6:
    iVar9 = 0;
    *(byte *)&stream->http_flags = (byte)stream->http_flags | 0x40;
  }
switchD_00114fe7_caseD_38:
  return iVar9;
}

Assistant:

int nghttp2_http_on_header(nghttp2_session *session, nghttp2_stream *stream,
                           nghttp2_frame *frame, nghttp2_hd_nv *nv,
                           int trailer) {
  int rv;

  /* We are strict for pseudo header field.  One bad character should
     lead to fail.  OTOH, we should be a bit forgiving for regular
     headers, since existing public internet has so much illegal
     headers floating around and if we kill the stream because of
     this, we may disrupt many web sites and/or libraries.  So we
     become conservative here, and just ignore those illegal regular
     headers. */
  if (!nghttp2_check_header_name(nv->name->base, nv->name->len)) {
    size_t i;
    if (nv->name->len > 0 && nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* header field name must be lower-cased without exception */
    for (i = 0; i < nv->name->len; ++i) {
      uint8_t c = nv->name->base[i];
      if ('A' <= c && c <= 'Z') {
        return NGHTTP2_ERR_HTTP_HEADER;
      }
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  switch (nv->token) {
  case NGHTTP2_TOKEN__METHOD:
    rv = nghttp2_check_method(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PATH:
    rv = nghttp2_check_path(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__AUTHORITY:
  case NGHTTP2_TOKEN_HOST:
    if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
      rv = check_authority(nv->value->base, nv->value->len);
    } else if (
      stream->flags &
      NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
    break;
  case NGHTTP2_TOKEN__SCHEME:
    rv = check_scheme(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PROTOCOL:
    /* Check the value consists of just white spaces, which was done
       in check_pseudo_header before
       nghttp2_check_header_value_rfc9113 has been introduced. */
    if ((stream->flags &
         NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) &&
        lws(nv->value->base, nv->value->len)) {
      rv = 0;
      break;
    }
    /* fall through */
  default:
    if (stream->flags &
        NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
  }

  if (rv == 0) {
    assert(nv->name->len > 0);
    if (nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    return http_request_on_header(stream, nv, trailer,
                                  session->server &&
                                    session->pending_enable_connect_protocol);
  }

  return http_response_on_header(stream, nv, trailer);
}